

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O0

SUNErrCode N_VScaleVectorArray(int nvec,sunrealtype *c,N_Vector *X,N_Vector *Z)

{
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  SUNErrCode ier;
  int i;
  SUNErrCode local_28;
  int local_24;
  
  if (*(long *)(*(long *)(*in_RCX + 8) + 0x110) == 0) {
    for (local_24 = 0; local_24 < in_EDI; local_24 = local_24 + 1) {
      (**(code **)(*(long *)(*in_RCX + 8) + 0x78))
                (*(undefined8 *)(in_RSI + (long)local_24 * 8),
                 *(undefined8 *)(in_RDX + (long)local_24 * 8),in_RCX[local_24]);
    }
    local_28 = 0;
  }
  else {
    local_28 = (**(code **)(*(long *)(*in_RCX + 8) + 0x110))(in_EDI,in_RSI,in_RDX,in_RCX);
  }
  return local_28;
}

Assistant:

SUNErrCode N_VScaleVectorArray(int nvec, sunrealtype* c, N_Vector* X, N_Vector* Z)
{
  int i;
  SUNErrCode ier;

  SUNDIALS_MARK_FUNCTION_BEGIN(getSUNProfiler(X[0]));

  if (Z[0]->ops->nvscalevectorarray != NULL)
  {
    ier = Z[0]->ops->nvscalevectorarray(nvec, c, X, Z);
  }
  else
  {
    for (i = 0; i < nvec; i++) { Z[0]->ops->nvscale(c[i], X[i], Z[i]); }
    ier = SUN_SUCCESS;
  }

  SUNDIALS_MARK_FUNCTION_END(getSUNProfiler(X[0]));
  return (ier);
}